

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::testGroupEnded
          (StreamingReporterBase<Catch::TestEventListenerBase> *this,TestGroupStats *param_1)

{
  Option<Catch::GroupInfo>::reset(&(this->currentGroupInfo).super_Option<Catch::GroupInfo>);
  (this->currentGroupInfo).used = false;
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& /* _testGroupStats */) override {
            currentGroupInfo.reset();
        }